

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

HttpResponse * asl::Http::request(HttpResponse *__return_storage_ptr__,HttpRequest *request)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  size_t in_RCX;
  sockaddr *__addr;
  void *__buf;
  String *s;
  Socket socket;
  Array<asl::String> parts;
  String title;
  String line;
  HttpResponse response;
  String local_1f8;
  String loc;
  Url url;
  HttpRequest local_178;
  
  socket.super_SmartObject._p = (SmartObject)(SmartObject_ *)0x0;
  HttpResponse::HttpResponse(&response,request);
  HttpResponse::setCode(&response,0);
  Url::Url(&url,&request->_url);
  iVar3 = url.port;
  bVar1 = String::operator==(&url.protocol,"https");
  if (bVar1) {
    String::String((String *)&local_178,"SOCKET_NO_TLS_AVAILABLE");
    String::operator=(&response.super_HttpMessage._socketError,(String *)&local_178);
  }
  else {
    Socket::Socket((Socket *)&local_178);
    SmartObject::operator=(&socket.super_SmartObject,(SmartObject *)&local_178);
    SmartObject::~SmartObject((SmartObject *)&local_178);
    if (iVar3 == 0) {
      url.port = 0x50;
      __addr = (sockaddr *)0x50;
    }
    else {
      __addr = (sockaddr *)(ulong)(uint)url.port;
    }
    (request->super_HttpMessage)._socket = (Socket *)&socket.super_SmartObject;
    response.super_HttpMessage._socket = (Socket *)&socket.super_SmartObject;
    iVar2 = Socket::connect((Socket *)&socket.super_SmartObject,(int)&url.host,__addr,
                            (socklen_t)in_RCX);
    if ((char)iVar2 != '\0') {
      if (*(int *)((request->super_HttpMessage)._body._a + -0x10) != 0) {
        String::String((String *)&local_178,"Content-Length");
        String::String(&title,*(int *)((request->super_HttpMessage)._body._a + -0x10));
        HttpMessage::setHeader(&request->super_HttpMessage,(String *)&local_178,&title);
        String::~String(&title);
        String::~String((String *)&local_178);
      }
      title.field_2._space[0] = '\0';
      title._size = 0;
      title._len = 0;
      String::operator+=(&title,&request->_method);
      String::operator+=(&title,' ');
      String::operator+=(&title,&url.path);
      String::operator+=(&title," HTTP/1.1\r\nHost: ");
      String::operator+=(&title,&url.host);
      if (iVar3 != 0) {
        String::operator+=(&title,':');
        String::operator<<(&title,&url.port);
      }
      s = &title;
      String::operator=((String *)request,s);
      sVar4 = HttpMessage::write(&request->super_HttpMessage,(int)s,__buf,in_RCX);
      if ((char)sVar4 == '\0') {
        (**(code **)(*(long *)socket.super_SmartObject._p + 0x80))(&local_178);
        String::operator=(&response.super_HttpMessage._socketError,(String *)&local_178);
        String::~String((String *)&local_178);
        HttpResponse::HttpResponse(__return_storage_ptr__,&response);
      }
      else {
        Socket_::readLine(&line,(Socket_ *)socket.super_SmartObject._p);
        if (line._len < 1) {
          (**(code **)(*(long *)socket.super_SmartObject._p + 0x58))();
          (**(code **)(*(long *)socket.super_SmartObject._p + 0x80))(&local_178);
          String::operator=(&response.super_HttpMessage._socketError,(String *)&local_178);
          String::~String((String *)&local_178);
          HttpResponse::HttpResponse(__return_storage_ptr__,&response);
        }
        else {
          String::split((String *)&parts);
          if (*(int *)&parts._a[-1].field_2 < 2) {
            (**(code **)(*(long *)socket.super_SmartObject._p + 0x58))();
            (**(code **)(*(long *)socket.super_SmartObject._p + 0x80))(&local_178);
            String::operator=(&response.super_HttpMessage._socketError,(String *)&local_178);
            String::~String((String *)&local_178);
            HttpResponse::HttpResponse(__return_storage_ptr__,&response);
          }
          else {
            String::operator=(&response.super_HttpMessage._proto,parts._a);
            iVar3 = String::operator_cast_to_int(parts._a + 1);
            HttpResponse::setCode(&response,iVar3);
            HttpMessage::readHeaders(&response.super_HttpMessage);
            if (((request->_followRedirects == true) && (response._code - 0x12dU < 8)) &&
               ((0xc3U >> (response._code - 0x12dU & 0x1f) & 1) != 0)) {
              (**(code **)(*(long *)socket.super_SmartObject._p + 0x58))();
              String::String((String *)&local_178,"Location");
              HttpMessage::header(&loc,&response.super_HttpMessage,(String *)&local_178);
              String::~String((String *)&local_178);
              HttpRequest::HttpRequest(&local_178,request);
              HttpRequest::setUrl(&local_178,&loc);
              if (request->_recursion < 3) {
                local_178._recursion = request->_recursion + 1;
                Http::request(__return_storage_ptr__,&local_178);
              }
              else {
                HttpResponse::setCode(&response,0x1a5);
                String::String(&local_1f8,"Too many redirects");
                String::operator=(&response.super_HttpMessage._socketError,&local_1f8);
                String::~String(&local_1f8);
                HttpResponse::HttpResponse(__return_storage_ptr__,&response);
              }
              HttpRequest::~HttpRequest(&local_178);
              String::~String(&loc);
            }
            else {
              response.super_HttpMessage._progress.f = (request->super_HttpMessage)._progress.f;
              (request->super_HttpMessage)._progress.f =
                   (_FuncB<void,_const_asl::HttpStatus_&,_asl::NoType> *)0x0;
              HttpMessage::useSink(&response.super_HttpMessage,&(request->super_HttpMessage)._sink);
              HttpMessage::readBody(&response.super_HttpMessage);
              (**(code **)(*(long *)socket.super_SmartObject._p + 0x58))();
              HttpResponse::HttpResponse(__return_storage_ptr__,&response);
            }
          }
          Array<asl::String>::~Array(&parts);
        }
        String::~String(&line);
      }
      String::~String(&title);
      goto LAB_00128eca;
    }
    (**(code **)(*(long *)socket.super_SmartObject._p + 0x58))();
    (**(code **)(*(long *)socket.super_SmartObject._p + 0x80))(&local_178);
    String::operator=(&response.super_HttpMessage._socketError,(String *)&local_178);
  }
  String::~String((String *)&local_178);
  HttpResponse::HttpResponse(__return_storage_ptr__,&response);
LAB_00128eca:
  Url::~Url(&url);
  HttpMessage::~HttpMessage(&response.super_HttpMessage);
  SmartObject::~SmartObject(&socket.super_SmartObject);
  return __return_storage_ptr__;
}

Assistant:

HttpResponse Http::request(HttpRequest& request)
{
	Socket socket((Socket::Ptr)NULL);
	HttpResponse response(request);
	response.setCode(0);

	Url url(request.url());
	bool hasPort = url.port != 0;

	if (url.protocol == "https")
	{
#ifdef ASL_TLS
		socket = TlsSocket();
		if (!hasPort) url.port = 443;
#else
		response.setSockError("SOCKET_NO_TLS_AVAILABLE");
		return response;
#endif
	}
	else {
		socket = Socket();
		if (!hasPort) url.port = 80;
	}

	response.use(socket);
	request.use(socket);

	if (!socket.connect(url.host, url.port)) {
		//printf("Cannot connect to %s : %i\n", *url.host, url.port);
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}
	
	if (request.body().length() != 0) {
		request.setHeader("Content-Length", request.body().length());
	}

	String title;
	title << request.method() << ' ' << url.path << " HTTP/1.1\r\nHost: " << url.host;
	if (hasPort)
		title << ':' << url.port;
	request._command = title;

	if (!request.write())
	{
		response.setSockError(socket.errorMsg());
		return response;
	}
	
	String line = socket.readLine();
	if (!line.ok()) {
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}
	Array<String> parts = line.split();
	if (parts.length() < 2) {
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}

	response.setProto(parts[0]);
	response.setCode(parts[1]);
	response.readHeaders();

	int code = response.code();

	if (request.followRedirects() && (code == 301 || code == 302 || code == 307 || code == 308)) // 303 ?
	{
		socket.close();
		String loc = response.header("Location");
		HttpRequest req(request);
		req.setUrl(loc);
		Http::Progress progress = req._progress;
		req.onProgress(progress);
		int n = request.recursion() + 1;
		if (n < 4) {
			req.setRecursion(n);
			return Http::request(req);
		}
		else {
			response.setCode(421);
			response.setSockError("Too many redirects");
			return response;
		}
	}

	response.onProgress(request._progress);
	response.useSink(request._sink);

	response.readBody();

	socket.close();
	return response;
}